

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O1

Rwt_Man_t * Rwt_ManStart(int fPrecompute)

{
  int iVar1;
  Rwt_Man_t *p;
  char *pcVar2;
  Rwt_Node_t **__s;
  Mem_Fixed_t *pMVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  char **ppcVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  size_t __size;
  timespec ts;
  timespec local_38;
  
  clock_gettime(3,&local_38);
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar9 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p = (Rwt_Man_t *)malloc(0x480);
  memset(p,0,0x480);
  p->nFuncs = 0x10000;
  if (s_puCanons == (unsigned_short *)0x0) {
    Extra_Truth4VarNPN(&s_puCanons,&s_pPhases,&s_pPerms,&s_pMap);
  }
  p->puCanons = s_puCanons;
  p->pPhases = s_pPhases;
  p->pPerms = s_pPerms;
  p->pMap = s_pMap;
  pcVar2 = Rwt_ManGetPractical(p);
  p->pPractical = pcVar2;
  __size = (long)p->nFuncs << 3;
  __s = (Rwt_Node_t **)malloc(__size);
  p->pTable = __s;
  memset(__s,0,__size);
  pMVar3 = Mem_FixedStart(0x28);
  p->pMmNode = pMVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  p->vForest = pVVar4;
  Rwt_ManAddVar(p,0,fPrecompute);
  Rwt_ManAddVar(p,0xaaaa,fPrecompute);
  Rwt_ManAddVar(p,0xcccc,fPrecompute);
  Rwt_ManAddVar(p,0xf0f0,fPrecompute);
  Rwt_ManAddVar(p,0xff00,fPrecompute);
  p->nClasses = 5;
  p->nTravIds = 1;
  ppcVar6 = Extra_Permutations(4);
  p->pPerms4 = ppcVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x32;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(200);
  pVVar7->pArray = piVar8;
  p->vLevNums = pVVar7;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0x32;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(400);
  pVVar4->pArray = ppvVar5;
  p->vFanins = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0x32;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(400);
  pVVar4->pArray = ppvVar5;
  p->vFaninsCur = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 0x32;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(400);
  pVVar4->pArray = ppvVar5;
  p->vNodesTemp = pVVar4;
  if (fPrecompute == 0) {
    Rwt_ManLoadFromArray(p,0);
    Rwt_ManPreprocess(p);
  }
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeStart = lVar10 + lVar9;
  return p;
}

Assistant:

Rwt_Man_t * Rwt_ManStart( int fPrecompute )
{
    Rwt_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwt_Man_t, 1 );
    memset( p, 0, sizeof(Rwt_Man_t) );
    p->nFuncs = (1<<16);
    // copy the global tables
    Rwt_ManGlobalStart();
    p->puCanons = s_puCanons; 
    p->pPhases  = s_pPhases; 
    p->pPerms   = s_pPerms; 
    p->pMap     = s_pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwt_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwt_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwt_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Mem_FixedStart( sizeof(Rwt_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwt_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwt_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwt_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwt_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwt_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
//        Rwt_ManPrecompute( p );
//        Rwt_ManPrint( p );
//        Rwt_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwt_ManLoadFromArray( p, 0 );
//        Rwt_ManPrint( p );
        Rwt_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}